

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

int __thiscall Epanet::Project::advanceSolver(Project *this,int *dt)

{
  HydEngine::advance(&this->hydEngine,dt);
  if (*dt == 0) {
    finalizeSolver(this);
  }
  else if (this->runQuality == true) {
    QualEngine::solve(&this->qualEngine,*dt);
  }
  return 0;
}

Assistant:

int Project::advanceSolver(int* dt)
    {
        try
        {
            // ... advance to time when new hydraulics need to be computed
            hydEngine.advance(dt);

            // ... if at end of simulation (dt == 0) then finalize results
            if ( *dt == 0 ) finalizeSolver();

            // ... otherwise update water quality over the time step
            else if ( runQuality ) qualEngine.solve(*dt);
            return 0;
        }
        catch (ENerror const& e)
        {
            writeMsg(e.msg);
            return e.code;
        }
    }